

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O0

bool __thiscall ManifestParser::ParseDefault(ManifestParser *this,string *err)

{
  State *this_00;
  bool bVar1;
  StringPiece local_c8;
  uint64_t local_b8;
  uint64_t slash_bits;
  string path_err;
  string path;
  string local_68;
  int local_48;
  undefined1 local_38 [8];
  EvalString eval;
  string *err_local;
  ManifestParser *this_local;
  
  eval.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)err;
  EvalString::EvalString((EvalString *)local_38);
  bVar1 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_38,
                          &(eval.parsed_.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
  if (bVar1) {
    bVar1 = EvalString::empty((EvalString *)local_38);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"expected target name",
                 (allocator<char> *)(path.field_2._M_local_buf + 0xf));
      this_local._7_1_ =
           Lexer::Error(&(this->super_Parser).lexer_,&local_68,
                        &(eval.parsed_.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)(path.field_2._M_local_buf + 0xf));
      local_48 = 1;
    }
    else {
      do {
        EvalString::Evaluate_abi_cxx11_
                  ((string *)((long)&path_err.field_2 + 8),(EvalString *)local_38,
                   &this->env_->super_Env);
        std::__cxx11::string::string((string *)&slash_bits);
        bVar1 = CanonicalizePath((string *)((long)&path_err.field_2 + 8),&local_b8,
                                 (string *)&slash_bits);
        if (bVar1) {
          this_00 = (this->super_Parser).state_;
          StringPiece::StringPiece(&local_c8,(string *)((long)&path_err.field_2 + 8));
          bVar1 = State::AddDefault(this_00,local_c8,(string *)&slash_bits);
          if (bVar1) {
            EvalString::Clear((EvalString *)local_38);
            bVar1 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_38,
                                    &(eval.parsed_.
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
            if (bVar1) {
              local_48 = 0;
            }
            else {
              this_local._7_1_ = 0;
              local_48 = 1;
            }
          }
          else {
            this_local._7_1_ =
                 Lexer::Error(&(this->super_Parser).lexer_,(string *)&slash_bits,
                              &(eval.parsed_.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
            local_48 = 1;
          }
        }
        else {
          this_local._7_1_ =
               Lexer::Error(&(this->super_Parser).lexer_,(string *)&slash_bits,
                            &(eval.parsed_.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
          local_48 = 1;
        }
        std::__cxx11::string::~string((string *)&slash_bits);
        std::__cxx11::string::~string((string *)(path_err.field_2._M_local_buf + 8));
        if (local_48 != 0) goto LAB_00140eb5;
        bVar1 = EvalString::empty((EvalString *)local_38);
      } while (((bVar1 ^ 0xffU) & 1) != 0);
      bVar1 = Parser::ExpectToken(&this->super_Parser,NEWLINE,
                                  &(eval.parsed_.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
      if (bVar1) {
        this_local._7_1_ = 1;
        local_48 = 1;
      }
      else {
        this_local._7_1_ = 0;
        local_48 = 1;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
    local_48 = 1;
  }
LAB_00140eb5:
  EvalString::~EvalString((EvalString *)local_38);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ManifestParser::ParseDefault(string* err) {
  EvalString eval;
  if (!lexer_.ReadPath(&eval, err))
    return false;
  if (eval.empty())
    return lexer_.Error("expected target name", err);

  do {
    string path = eval.Evaluate(env_);
    string path_err;
    uint64_t slash_bits;  // Unused because this only does lookup.
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    if (!state_->AddDefault(path, &path_err))
      return lexer_.Error(path_err, err);

    eval.Clear();
    if (!lexer_.ReadPath(&eval, err))
      return false;
  } while (!eval.empty());

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  return true;
}